

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_tracemc(lua_State *L)

{
  double *pdVar1;
  GCtrace *pGVar2;
  undefined4 *puVar3;
  GCstr *pGVar4;
  long in_RDI;
  GCtrace *T;
  lua_State *in_stack_ffffffffffffff58;
  int local_8c;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  
  pGVar2 = jit_checktrace(in_stack_ffffffffffffff58);
  if ((pGVar2 == (GCtrace *)0x0) || (pGVar2->mcode == (MCode *)0x0)) {
    local_8c = 0;
  }
  else {
    puVar3 = (undefined4 *)(*(long *)(in_RDI + 0x18) + -8);
    pGVar4 = lj_str_new(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    *puVar3 = (int)pGVar4;
    puVar3[1] = 0xfffffffb;
    pdVar1 = *(double **)(in_RDI + 0x18);
    *(double **)(in_RDI + 0x18) = pdVar1 + 1;
    *pdVar1 = (double)(long)pGVar2->mcode;
    pdVar1 = *(double **)(in_RDI + 0x18);
    *(double **)(in_RDI + 0x18) = pdVar1 + 1;
    *pdVar1 = (double)(int)pGVar2->mcloop;
    local_8c = 3;
  }
  return local_8c;
}

Assistant:

LJLIB_CF(jit_util_tracemc)
{
  GCtrace *T = jit_checktrace(L);
  if (T && T->mcode != NULL) {
    setstrV(L, L->top-1, lj_str_new(L, (const char *)T->mcode, T->szmcode));
    setintptrV(L->top++, (intptr_t)(void *)T->mcode);
    setintV(L->top++, T->mcloop);
    return 3;
  }
  return 0;
}